

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O3

unique_ptr<helics::Message,_std::default_delete<helics::Message>_>
getMessageUniquePtr(HelicsMessage message,HelicsError *err)

{
  char *pcVar1;
  int *in_RDX;
  
  if (in_RDX == (int *)0x0) {
    if (((err != (HelicsError *)0x0) && (*(short *)((long)&err->message + 2) == 0xb3)) &&
       (pcVar1 = err[0xf].message, pcVar1 != (char *)0x0)) {
LAB_001aa34e:
      helics::MessageHolder::extractMessage((MessageHolder *)message,(int)pcVar1);
      if (in_RDX == (int *)0x0) {
        return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
               (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
               message;
      }
      if (*message != 0) {
        return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
               (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
               message;
      }
      *in_RDX = -4;
      *(char **)(in_RDX + 2) = "the message is NULL";
      return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
             (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
             message;
    }
  }
  else if (*in_RDX == 0) {
    if ((err == (HelicsError *)0x0) || (*(short *)((long)&err->message + 2) != 0xb3)) {
      *in_RDX = -4;
      pcVar1 = "The message object was not valid";
    }
    else {
      pcVar1 = err[0xf].message;
      if (pcVar1 != (char *)0x0) goto LAB_001aa34e;
      *in_RDX = -4;
      pcVar1 = "the message is NULL";
    }
    *(char **)(in_RDX + 2) = pcVar1;
  }
  *(undefined8 *)message = 0;
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)message
  ;
}

Assistant:

std::unique_ptr<helics::Message> getMessageUniquePtr(HelicsMessage message, HelicsError* err)
{
    static constexpr char invalidLocationString[] = "the message is NULL";
    auto* mess = getMessageObj(message, err);
    if (mess == nullptr) {
        return nullptr;
    }
    auto* messages = reinterpret_cast<helics::MessageHolder*>(mess->backReference);
    if (messages != nullptr) {
        auto ptr = messages->extractMessage(mess->counter);
        if (!ptr) {
            assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidLocationString);
        }
        return ptr;
    }
    assignError(err, HELICS_ERROR_INVALID_ARGUMENT, emptyMessageErrorString);
    return nullptr;
}